

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool __thiscall CConsole::ArgStringIsValid(CConsole *this,char *pFormat)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char Command;
  char local_29;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = *pFormat;
  bVar1 = true;
  bVar2 = false;
  local_28 = pFormat;
  while( true ) {
    if ((!bVar1) || (local_29 == '\0')) goto LAB_001a6859;
    if ((bVar2) && (*local_28 != '\0')) break;
    if (((local_29 != 's') && (local_29 != 'f')) && (local_29 != 'i')) {
      if (local_29 == 'r') {
        bVar2 = true;
      }
      else if ((local_29 != '?') || (local_28[1] == '\0')) break;
    }
    bVar1 = NextParam(this,&local_29,&local_28);
    bVar1 = !bVar1;
  }
  bVar1 = false;
LAB_001a6859:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CConsole::ArgStringIsValid(const char *pFormat)
{
	char Command = *pFormat;
	bool Valid = true;
	bool Last = false;

	while(Valid)
	{
		if(!Command)
			break;

		if(Last && *pFormat)
			return false;

		if(Command == '?')
		{
			if(!pFormat[1])
				return false;
		}
		else
		{
			if(Command == 'i' || Command == 'f' || Command == 's')
				;
			else if(Command == 'r')
				Last = true;
			else
				return false;
		}

		Valid = !NextParam(&Command, pFormat);
	}

	return Valid;
}